

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void burstsort2_sampling_superalphabet_bagwell(uchar **strings,size_t n)

{
  byte bVar1;
  ulong uVar2;
  TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *root;
  pointer ppvVar3;
  undefined8 *puVar4;
  TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *this;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  byte *pbVar5;
  long lVar6;
  uint index;
  ulong uVar8;
  _func_void_uchar_ptr_ptr_int_int *p_Var7;
  
  root = (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n != 0) {
    lVar6 = 2000;
    uVar8 = 0;
    do {
      if (strings[uVar8] == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      pbVar5 = strings[uVar8] + 1;
      this = root;
      while (pbVar5[-1] != 0) {
        bVar1 = *pbVar5;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar1;
        if (bVar1 == 0) break;
        index = (uint)CONCAT11(pbVar5[-1],bVar1);
        p_Var7 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)index;
        ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                 ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3);
        if (in_RCX < (_func_void_uchar_ptr_ptr_int_int *)(ulong)(index + 1)) {
          std::vector<void_*,_std::allocator<void_*>_>::resize
                    (&this->_buckets,(size_type)(ulong)(index + 1));
          ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3);
        }
        if ((in_RCX <= p_Var7) || (((ulong)ppvVar3[(long)p_Var7] & 1) == 0)) {
          puVar4 = (undefined8 *)operator_new(0x18);
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4[2] = 0;
          *(undefined8 **)
           ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + (ulong)(index * 8)) = puVar4;
          ppvVar3 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar2 = *(ulong *)((long)ppvVar3 + (ulong)(index * 8));
          if (uVar2 == 0) {
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x5c,"void make_trie(void *&)");
          }
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(uVar2 | 1);
          ppvVar3[(long)p_Var7] = in_RCX;
          lVar6 = lVar6 + -1;
          if (lVar6 == 0) goto LAB_001abeb0;
        }
        this = TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::get_node(this,index)
        ;
        pbVar5 = pbVar5 + 2;
        if (this == (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xd9,
                        "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = vector_bagwell<unsigned char *>]"
                       );
        }
      }
      uVar8 = uVar8 + 0x2000;
    } while (uVar8 < n);
  }
LAB_001abeb0:
  insert<32768u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_short>,unsigned_short>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_bagwell<unsigned_char*,16u>,unsigned_short>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_bagwell(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_bagwell<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}